

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtilizationContainer.cpp
# Opt level: O1

void __thiscall
MemoryUtilizationContainer::MemoryUtilizationContainer(MemoryUtilizationContainer *this)

{
  int iVar1;
  UtilizationWidget *this_00;
  FlowGridLayout *pFVar2;
  GPUMemDetailsWidget *this_01;
  int gpuId;
  QByteArrayView QVar3;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  QWidget::QWidget((QWidget *)this,0,0);
  *(undefined ***)&this->super_UtilizationContainer = &PTR_metaObject_0012b768;
  *(undefined ***)&(this->super_UtilizationContainer).field_0x10 =
       &PTR__MemoryUtilizationContainer_0012b918;
  this_00 = (UtilizationWidget *)operator_new(0x2868);
  MemoryUtilizationWidget::MemoryUtilizationWidget
            ((MemoryUtilizationWidget *)this_00,&this->super_UtilizationContainer);
  (this->super_UtilizationContainer).utilizationWidget = this_00;
  QVar3.m_data = (storage_type *)0x12;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  UtilizationContainer::build(&this->super_UtilizationContainer,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  gpuId = 0;
  while( true ) {
    iVar1 = InfoProvider::getGPUCount();
    if (iVar1 <= gpuId) break;
    pFVar2 = UtilizationContainer::getDescLayout(&this->super_UtilizationContainer);
    this_01 = (GPUMemDetailsWidget *)operator_new(0x28);
    GPUMemDetailsWidget::GPUMemDetailsWidget(this_01,&this->super_UtilizationContainer,gpuId);
    QLayout::addWidget((QWidget *)pFVar2);
    gpuId = gpuId + 1;
  }
  UtilizationContainer::updateLegend(&this->super_UtilizationContainer);
  return;
}

Assistant:

MemoryUtilizationContainer::MemoryUtilizationContainer() {
    utilizationWidget = new MemoryUtilizationWidget(this);
    build("Memory Utilization");

    for (int i = 0; i < InfoProvider::getGPUCount(); i++)
        getDescLayout()->addWidget(new GPUMemDetailsWidget(this, i));

    updateLegend();
}